

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O0

HCOSE_RECIPIENT COSE_Enveloped_GetRecipient(HCOSE_ENVELOPED cose,int iRecipient,cose_errback *perr)

{
  _Bool _Var1;
  HCOSE_RECIPIENT local_30;
  COSE_RecipientInfo *p;
  int i;
  cose_errback *perr_local;
  int iRecipient_local;
  HCOSE_ENVELOPED cose_local;
  
  local_30 = (HCOSE_RECIPIENT)0x0;
  _Var1 = IsValidEnvelopedHandle(cose);
  if (_Var1) {
    if (iRecipient < 0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
    else {
      local_30 = *(HCOSE_RECIPIENT *)(cose + 0x68);
      for (p._4_4_ = 0; p._4_4_ < iRecipient; p._4_4_ = p._4_4_ + 1) {
        if (local_30 == (HCOSE_RECIPIENT)0x0) {
          if (perr == (cose_errback *)0x0) {
            return (HCOSE_RECIPIENT)0x0;
          }
          perr->err = COSE_ERR_INVALID_PARAMETER;
          return (HCOSE_RECIPIENT)0x0;
        }
        local_30 = *(HCOSE_RECIPIENT *)(local_30 + 0x70);
      }
      if (local_30 != (HCOSE_RECIPIENT)0x0) {
        *(int *)(local_30 + 0x10) = *(int *)(local_30 + 0x10) + 1;
      }
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return local_30;
}

Assistant:

HCOSE_RECIPIENT COSE_Enveloped_GetRecipient(HCOSE_ENVELOPED cose, int iRecipient, cose_errback * perr)
{
	int i;
	COSE_RecipientInfo * p = NULL;

	CHECK_CONDITION(IsValidEnvelopedHandle(cose), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(iRecipient >= 0, COSE_ERR_INVALID_PARAMETER);

	p = ((COSE_Enveloped *)cose)->m_recipientFirst;
	for (i = 0; i < iRecipient; i++) {
		CHECK_CONDITION(p != NULL, COSE_ERR_INVALID_PARAMETER);
		p = p->m_recipientNext;
	}
	if (p != NULL) p->m_encrypt.m_message.m_refCount++;

errorReturn:
	return (HCOSE_RECIPIENT)p;
}